

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cRobustnessTests.cpp
# Opt level: O3

void __thiscall
gl4cts::RobustnessRobustBufferAccessBehavior::ReadnPixelsTest::cleanTexture
          (ReadnPixelsTest *this,GLuint texture_id)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  GLubyte pixels [64];
  long lVar3;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  builtin_memcpy(pixels + 0x30,"@@@@@@@@@@@@@@@@",0x10);
  builtin_memcpy(pixels + 0x20,"@@@@@@@@@@@@@@@@",0x10);
  builtin_memcpy(pixels + 0x10,"@@@@@@@@@@@@@@@@",0x10);
  builtin_memcpy(pixels,"@@@@@@@@@@@@@@@@",0x10);
  (**(code **)(lVar3 + 0xb8))(0xde1,texture_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cRobustnessTests.cpp"
                  ,0x330);
  (**(code **)(lVar3 + 0x13b8))(0xde1,0,0,0,8,8,0x8d94,0x1401,pixels);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"TexSubImage2D",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cRobustnessTests.cpp"
                  ,0x441);
  (**(code **)(lVar3 + 0xb8))(0xde1,0);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cRobustnessTests.cpp"
                  ,0x330);
  return;
}

Assistant:

void ReadnPixelsTest::cleanTexture(glw::GLuint texture_id)
{
	static const GLuint height = 8;
	static const GLuint width  = 8;

	const Functions& gl = m_context.getRenderContext().getFunctions();

	GLubyte pixels[width * height];
	for (GLuint i = 0; i < width * height; ++i)
	{
		pixels[i] = 64;
	}

	Texture::Bind(gl, texture_id, GL_TEXTURE_2D);

	Texture::SubImage(gl, GL_TEXTURE_2D, 0 /* level  */, 0 /* x */, 0 /* y */, 0 /* z */, width, height, 0 /* depth */,
					  GL_RED_INTEGER, GL_UNSIGNED_BYTE, pixels);

	/* Unbind */
	Texture::Bind(gl, 0, GL_TEXTURE_2D);
}